

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O3

void loadBool(item *x)

{
  typeDesc *ptVar1;
  
  ptVar1 = getType(x->typeIndex);
  if (ptVar1->form == 0x325) {
    load(x);
    x->mode = 0x2c3;
    x->a = 0;
    x->b = 0;
    x->c = 1;
    return;
  }
  mark("not bool");
  exit(-1);
}

Assistant:

procedure
void loadBool(struct item *x) {
	variable struct typeDesc *type;
	type = getType(x->typeIndex);
	if (type->form != FORM_BOOL){
		mark("not bool");
		exit(-1);
	}
	load(x);
	x->mode = CLASS_COND;
	x->a = 0; x->b = 0; x->c = 1;
}